

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O3

string * __thiscall
deqp::egl::(anonymous_namespace)::configListToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Library *egl,
          EGLDisplay *display,vector<void_*,_std::allocator<void_*>_> *configs)

{
  EGLint EVar1;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar2;
  undefined8 *puVar3;
  string *local_1d8;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8.field_2._M_allocated_capacity = (size_type)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1c8.field_2._M_allocated_capacity;
  local_1c8.field_2._8_8_ = egl;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,0x1af8059);
  puVar3 = (undefined8 *)*display;
  psVar2 = extraout_RAX;
  if (puVar3 != (undefined8 *)display[1]) {
    do {
      EVar1 = eglu::getConfigID((Library *)this,*(_func_int ***)local_1c8.field_2._8_8_,
                                (EGLConfig)*puVar3);
      if (__return_storage_ptr__->_M_string_length != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,EVar1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1d8);
      psVar2 = &local_1c8;
      if (local_1d8 != psVar2) {
        operator_delete(local_1d8,(ulong)(local_1c8._M_dataplus._M_p + 1));
        psVar2 = extraout_RAX_00;
      }
      puVar3 = puVar3 + 1;
    } while (puVar3 != (undefined8 *)display[1]);
  }
  return psVar2;
}

Assistant:

string configListToString (const Library& egl, const EGLDisplay& display, const vector<EGLConfig>& configs)
{
	string str = "";
	for (vector<EGLConfig>::const_iterator cfgIter = configs.begin(); cfgIter != configs.end(); cfgIter++)
	{
		EGLConfig	config		= *cfgIter;
		EGLint		configId	= eglu::getConfigID(egl, display, config);

		if (str.length() != 0)
			str += " ";

		str += de::toString(configId);
	}
	return str;
}